

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::ResponsesCache::ResponsesCache
          (ResponsesCache *this,event_base *aEventBase,Duration *aLifetime)

{
  anon_class_8_1_8991fb9c local_48;
  Action local_40;
  Duration *local_20;
  Duration *aLifetime_local;
  event_base *aEventBase_local;
  ResponsesCache *this_local;
  
  (this->mLifetime).__r = aLifetime->__r;
  local_48.this = this;
  local_20 = aLifetime;
  aLifetime_local = (Duration *)aEventBase;
  aEventBase_local = (event_base *)this;
  std::function<void(ot::commissioner::Timer&)>::
  function<ot::commissioner::coap::Coap::ResponsesCache::ResponsesCache(event_base*,std::chrono::duration<long,std::ratio<1l,1000l>>const&)::_lambda(ot::commissioner::Timer&)_1_,void>
            ((function<void(ot::commissioner::Timer&)> *)&local_40,&local_48);
  Timer::Timer(&this->mTimer,aEventBase,&local_40,true);
  std::function<void_(ot::commissioner::Timer_&)>::~function(&local_40);
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_ot::commissioner::coap::Message>_>_>
  ::multimap(&this->mContainer);
  return;
}

Assistant:

explicit ResponsesCache(struct event_base *aEventBase, const Duration &aLifetime)
            : mLifetime(aLifetime)
            , mTimer(aEventBase, [this](Timer &) { Eliminate(); })
        {
        }